

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O1

string * __thiscall
svg::Text::toString_abi_cxx11_(string *__return_storage_ptr__,Text *this,Layout *layout)

{
  double dVar1;
  long lVar2;
  long *plVar3;
  ostream *poVar4;
  long *plVar5;
  stringstream ss;
  long *local_388;
  long local_378;
  long lStack_370;
  long *local_368;
  long local_360;
  long local_358;
  long lStack_350;
  double local_348;
  double local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"text","");
  std::operator+(&local_338,"\t<",&local_2b8);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_338);
  local_388 = &local_378;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_378 = *plVar5;
    lStack_370 = plVar3[3];
  }
  else {
    local_378 = *plVar5;
    local_388 = (long *)*plVar3;
  }
  lVar2 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_388,lVar2);
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"x","");
  dVar1 = (this->origin).x;
  if ((layout->origin & ~BottomLeft) == TopRight) {
    local_340 = (layout->dimensions).width - (dVar1 + (layout->origin_offset).x) * layout->scale;
  }
  else {
    local_340 = (dVar1 + (layout->origin_offset).x) * layout->scale;
  }
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"");
  attribute<double>(&local_1d8,&local_1f8,&local_340,&local_2d8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"y","");
  dVar1 = (this->origin).y;
  if ((layout->origin | TopRight) == BottomRight) {
    local_348 = (layout->dimensions).height - (dVar1 + (layout->origin_offset).y) * layout->scale;
  }
  else {
    local_348 = (dVar1 + (layout->origin_offset).y) * layout->scale;
  }
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"");
  attribute<double>(&local_218,&local_2f8,&local_348,&local_318);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_218._M_dataplus._M_p,local_218._M_string_length);
  Fill::toString_abi_cxx11_(&local_238,&(this->super_Shape).fill,layout);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_238._M_dataplus._M_p,local_238._M_string_length);
  Stroke::toString_abi_cxx11_(&local_258,&(this->super_Shape).stroke,layout);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_258._M_dataplus._M_p,local_258._M_string_length);
  Font::toString_abi_cxx11_(&local_278,&this->font,layout);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_278._M_dataplus._M_p,local_278._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,">",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(this->content)._M_dataplus._M_p,(this->content)._M_string_length);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"text","");
  std::operator+(&local_338,"</",&local_298);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_338);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_358 = *plVar5;
    lStack_350 = plVar3[3];
    local_368 = &local_358;
  }
  else {
    local_358 = *plVar5;
    local_368 = (long *)*plVar3;
  }
  local_360 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_368,local_360);
  if (local_368 != &local_358) {
    operator_delete(local_368);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (local_388 != &local_378) {
    operator_delete(local_388);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Layout const & layout) const
        {
            std::stringstream ss;
            ss << elemStart("text") << attribute("x", translateX(origin.x, layout))
                << attribute("y", translateY(origin.y, layout))
                << fill.toString(layout) << stroke.toString(layout) << font.toString(layout)
                << ">" << content << elemEnd("text");
            return ss.str();
        }